

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

string * __thiscall
google::(anonymous_namespace)::ReadFileIntoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *filename)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  string *psVar4;
  FILE *fp;
  char buffer [8092];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = SafeFOpen(&fp,(char *)this,"r");
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  if (iVar1 != 0) {
    perror((char *)this);
    psVar4 = (string *)(*(code *)gflags_exitfunc)(1);
    return psVar4;
  }
  while( true ) {
    sVar3 = fread(buffer,1,0x1f9c,(FILE *)fp);
    if (sVar3 == 0) {
      fclose((FILE *)fp);
      return __return_storage_ptr__;
    }
    iVar1 = ferror((FILE *)fp);
    if (iVar1 != 0) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buffer);
  }
  perror((char *)this);
  psVar4 = (string *)(*(code *)gflags_exitfunc)(1);
  return psVar4;
}

Assistant:

static string ReadFileIntoString(const char* filename) {
  const int kBufSize = 8092;
  char buffer[kBufSize];
  string s;
  FILE* fp;
  if ((errno = SafeFOpen(&fp, filename, "r")) != 0) PFATAL(filename);
  size_t n;
  while ( (n=fread(buffer, 1, kBufSize, fp)) > 0 ) {
    if (ferror(fp))  PFATAL(filename);
    s.append(buffer, n);
  }
  fclose(fp);
  return s;
}